

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_game.cpp
# Opt level: O0

void Cmd_invprev(FCommandLine *argv,APlayerPawn *who,int key)

{
  FFont *font;
  DBaseStatusBar *this;
  bool bVar1;
  uint uVar2;
  EColorRange textColor;
  AInventory *pAVar3;
  DHUDMessageFadeOut *this_00;
  char *text;
  AInventory *newitem;
  AInventory *item;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  if (who != (APlayerPawn *)0x0) {
    bVar1 = TObjPtr<AInventory>::operator!=(&who->InvSel,(AInventory *)0x0);
    if (bVar1) {
      pAVar3 = TObjPtr<AInventory>::operator->(&who->InvSel);
      newitem = AInventory::PrevInv(pAVar3);
      if (newitem == (AInventory *)0x0) {
        pAVar3 = TObjPtr::operator_cast_to_AInventory_((TObjPtr *)&who->InvSel);
        do {
          newitem = pAVar3;
          pAVar3 = AInventory::NextInv(newitem);
        } while (pAVar3 != (AInventory *)0x0);
        TObjPtr<AInventory>::operator=(&who->InvSel,newitem);
      }
      else {
        TObjPtr<AInventory>::operator=(&who->InvSel,newitem);
      }
      uVar2 = FIntCVar::operator_cast_to_int(&displaynametags);
      if (((((uVar2 & 1) != 0) && (StatusBar != (DBaseStatusBar *)0x0)) &&
          (SmallFont != (FFont *)0x0)) &&
         (pAVar3 = TObjPtr::operator_cast_to_AInventory_((TObjPtr *)&who->InvSel), this = StatusBar,
         pAVar3 != (AInventory *)0x0)) {
        this_00 = (DHUDMessageFadeOut *)DObject::operator_new((DObject *)0xc8,(size_t)newitem);
        font = SmallFont;
        pAVar3 = TObjPtr<AInventory>::operator->(&who->InvSel);
        text = AActor::GetTag(&pAVar3->super_AActor,(char *)0x0);
        textColor = FIntCVar::operator*(&nametagcolor);
        DHUDMessageFadeOut::DHUDMessageFadeOut(this_00,font,text,1.5,0.8,0,0,textColor,2.0,0.35);
        DBaseStatusBar::AttachMessage(this,(DHUDMessage *)this_00,0x564e4953,0);
      }
    }
    ((who->super_AActor).player)->inventorytics = 0xaf;
  }
  return;
}

Assistant:

CCMD (invprev)
{
	AInventory *item, *newitem;

	if (who == NULL)
		return;

	if (who->InvSel != NULL)
	{
		if ((item = who->InvSel->PrevInv()) != NULL)
		{
			who->InvSel = item;
		}
		else
		{
			// Select the last item in the inventory
			item = who->InvSel;
			while ((newitem = item->NextInv()) != NULL)
			{
				item = newitem;
			}
			who->InvSel = item;
		}
		if ((displaynametags & 1) && StatusBar && SmallFont && who->InvSel)
			StatusBar->AttachMessage (new DHUDMessageFadeOut (SmallFont, who->InvSel->GetTag(), 
			1.5f, 0.80f, 0, 0, (EColorRange)*nametagcolor, 2.f, 0.35f), MAKE_ID('S','I','N','V'));
	}
	who->player->inventorytics = 5*TICRATE;
}